

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_kernel.h
# Opt level: O3

void __thiscall
dlib::
array<std::unique_ptr<dlib::thread_function,_std::default_delete<dlib::thread_function>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
::push_back(array<std::unique_ptr<dlib::thread_function,_std::default_delete<dlib::thread_function>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
            *this,unique_ptr<dlib::thread_function,_std::default_delete<dlib::thread_function>_>
                  *item)

{
  bool bVar1;
  unsigned_long uVar2;
  thread_function *ptVar3;
  unique_ptr<dlib::thread_function,_std::default_delete<dlib::thread_function>_> *puVar4;
  unsigned_long uVar5;
  unique_ptr<dlib::thread_function,_std::default_delete<dlib::thread_function>_> *puVar6;
  unique_ptr<dlib::thread_function,_std::default_delete<dlib::thread_function>_> *puVar7;
  int iVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  unsigned_long i;
  ulong uVar9;
  array<std::unique_ptr<dlib::thread_function,_std::default_delete<dlib::thread_function>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
  local_68;
  
  uVar2 = this->max_array_size;
  iVar8 = (*(this->
            super_enumerable<std::unique_ptr<dlib::thread_function,_std::default_delete<dlib::thread_function>_>_>
            )._vptr_enumerable[8])();
  if (uVar2 == CONCAT44(extraout_var,iVar8)) {
    local_68.
    super_enumerable<std::unique_ptr<dlib::thread_function,_std::default_delete<dlib::thread_function>_>_>
    ._vptr_enumerable = (_func_int **)&PTR__array_0030fc28;
    local_68.pool._vptr_memory_manager_stateless_kernel_1 =
         (_func_int **)&PTR__memory_manager_stateless_kernel_1_0030fca8;
    local_68.array_size = 0;
    local_68.max_array_size = 0;
    local_68.array_elements =
         (unique_ptr<dlib::thread_function,_std::default_delete<dlib::thread_function>_> *)0x0;
    local_68.pos = (unique_ptr<dlib::thread_function,_std::default_delete<dlib::thread_function>_> *
                   )0x0;
    local_68.last_pos =
         (unique_ptr<dlib::thread_function,_std::default_delete<dlib::thread_function>_> *)0x0;
    local_68._at_start = true;
    iVar8 = (*(this->
              super_enumerable<std::unique_ptr<dlib::thread_function,_std::default_delete<dlib::thread_function>_>_>
              )._vptr_enumerable[8])(this);
    set_max_size(&local_68,CONCAT44(extraout_var_00,iVar8) * 2 + 1);
    iVar8 = (*(this->
              super_enumerable<std::unique_ptr<dlib::thread_function,_std::default_delete<dlib::thread_function>_>_>
              )._vptr_enumerable[8])(this);
    set_size(&local_68,CONCAT44(extraout_var_01,iVar8) + 1);
    uVar9 = 0;
    while( true ) {
      iVar8 = (*(this->
                super_enumerable<std::unique_ptr<dlib::thread_function,_std::default_delete<dlib::thread_function>_>_>
                )._vptr_enumerable[8])(this);
      if (CONCAT44(extraout_var_02,iVar8) <= uVar9) break;
      ptVar3 = this->array_elements[uVar9]._M_t.
               super___uniq_ptr_impl<dlib::thread_function,_std::default_delete<dlib::thread_function>_>
               ._M_t.
               super__Tuple_impl<0UL,_dlib::thread_function_*,_std::default_delete<dlib::thread_function>_>
               .super__Head_base<0UL,_dlib::thread_function_*,_false>._M_head_impl;
      this->array_elements[uVar9]._M_t.
      super___uniq_ptr_impl<dlib::thread_function,_std::default_delete<dlib::thread_function>_>._M_t
      .super__Tuple_impl<0UL,_dlib::thread_function_*,_std::default_delete<dlib::thread_function>_>.
      super__Head_base<0UL,_dlib::thread_function_*,_false>._M_head_impl =
           local_68.array_elements[uVar9]._M_t.
           super___uniq_ptr_impl<dlib::thread_function,_std::default_delete<dlib::thread_function>_>
           ._M_t.
           super__Tuple_impl<0UL,_dlib::thread_function_*,_std::default_delete<dlib::thread_function>_>
           .super__Head_base<0UL,_dlib::thread_function_*,_false>._M_head_impl;
      local_68.array_elements[uVar9]._M_t.
      super___uniq_ptr_impl<dlib::thread_function,_std::default_delete<dlib::thread_function>_>._M_t
      .super__Tuple_impl<0UL,_dlib::thread_function_*,_std::default_delete<dlib::thread_function>_>.
      super__Head_base<0UL,_dlib::thread_function_*,_false>._M_head_impl = ptVar3;
      uVar9 = uVar9 + 1;
    }
    ptVar3 = (item->_M_t).
             super___uniq_ptr_impl<dlib::thread_function,_std::default_delete<dlib::thread_function>_>
             ._M_t.
             super__Tuple_impl<0UL,_dlib::thread_function_*,_std::default_delete<dlib::thread_function>_>
             .super__Head_base<0UL,_dlib::thread_function_*,_false>._M_head_impl;
    (item->_M_t).
    super___uniq_ptr_impl<dlib::thread_function,_std::default_delete<dlib::thread_function>_>._M_t.
    super__Tuple_impl<0UL,_dlib::thread_function_*,_std::default_delete<dlib::thread_function>_>.
    super__Head_base<0UL,_dlib::thread_function_*,_false>._M_head_impl =
         local_68.array_elements[local_68.array_size - 1]._M_t.
         super___uniq_ptr_impl<dlib::thread_function,_std::default_delete<dlib::thread_function>_>.
         _M_t.
         super__Tuple_impl<0UL,_dlib::thread_function_*,_std::default_delete<dlib::thread_function>_>
         .super__Head_base<0UL,_dlib::thread_function_*,_false>._M_head_impl;
    local_68.array_elements[local_68.array_size - 1]._M_t.
    super___uniq_ptr_impl<dlib::thread_function,_std::default_delete<dlib::thread_function>_>._M_t.
    super__Tuple_impl<0UL,_dlib::thread_function_*,_std::default_delete<dlib::thread_function>_>.
    super__Head_base<0UL,_dlib::thread_function_*,_false>._M_head_impl = ptVar3;
    puVar4 = this->array_elements;
    uVar2 = this->array_size;
    uVar5 = this->max_array_size;
    this->array_size = local_68.array_size;
    this->max_array_size = local_68.max_array_size;
    bVar1 = this->_at_start;
    this->_at_start = local_68._at_start;
    puVar6 = this->pos;
    puVar7 = this->last_pos;
    this->array_elements = local_68.array_elements;
    this->pos = local_68.pos;
    this->last_pos = local_68.last_pos;
    local_68.
    super_enumerable<std::unique_ptr<dlib::thread_function,_std::default_delete<dlib::thread_function>_>_>
    ._vptr_enumerable = (_func_int **)&PTR__array_0030fc28;
    if (puVar4 != (unique_ptr<dlib::thread_function,_std::default_delete<dlib::thread_function>_> *)
                  0x0) {
      local_68.array_size = uVar2;
      local_68.max_array_size = uVar5;
      local_68.array_elements = puVar4;
      local_68.pos = puVar6;
      local_68.last_pos = puVar7;
      local_68._at_start = bVar1;
      memory_manager_stateless_kernel_1<std::unique_ptr<dlib::thread_function,_std::default_delete<dlib::thread_function>_>_>
      ::deallocate_array(&local_68.pool,puVar4);
    }
  }
  else {
    iVar8 = (*(this->
              super_enumerable<std::unique_ptr<dlib::thread_function,_std::default_delete<dlib::thread_function>_>_>
              )._vptr_enumerable[8])(this);
    set_size(this,CONCAT44(extraout_var_03,iVar8) + 1);
    iVar8 = (*(this->
              super_enumerable<std::unique_ptr<dlib::thread_function,_std::default_delete<dlib::thread_function>_>_>
              )._vptr_enumerable[8])(this);
    puVar4 = this->array_elements;
    ptVar3 = (item->_M_t).
             super___uniq_ptr_impl<dlib::thread_function,_std::default_delete<dlib::thread_function>_>
             ._M_t.
             super__Tuple_impl<0UL,_dlib::thread_function_*,_std::default_delete<dlib::thread_function>_>
             .super__Head_base<0UL,_dlib::thread_function_*,_false>._M_head_impl;
    (item->_M_t).
    super___uniq_ptr_impl<dlib::thread_function,_std::default_delete<dlib::thread_function>_>._M_t.
    super__Tuple_impl<0UL,_dlib::thread_function_*,_std::default_delete<dlib::thread_function>_>.
    super__Head_base<0UL,_dlib::thread_function_*,_false>._M_head_impl =
         puVar4[CONCAT44(extraout_var_04,iVar8) + -1]._M_t.
         super___uniq_ptr_impl<dlib::thread_function,_std::default_delete<dlib::thread_function>_>.
         _M_t.
         super__Tuple_impl<0UL,_dlib::thread_function_*,_std::default_delete<dlib::thread_function>_>
         .super__Head_base<0UL,_dlib::thread_function_*,_false>._M_head_impl;
    puVar4[CONCAT44(extraout_var_04,iVar8) + -1]._M_t.
    super___uniq_ptr_impl<dlib::thread_function,_std::default_delete<dlib::thread_function>_>._M_t.
    super__Tuple_impl<0UL,_dlib::thread_function_*,_std::default_delete<dlib::thread_function>_>.
    super__Head_base<0UL,_dlib::thread_function_*,_false>._M_head_impl = ptVar3;
  }
  return;
}

Assistant:

void array<T,mem_manager>::
    push_back (
        T& item
    ) 
    {
        if (this->max_size() == this->size())
        {
            // double the size of the array
            array temp;
            temp.set_max_size(this->size()*2 + 1);
            temp.set_size(this->size()+1);
            for (unsigned long i = 0; i < this->size(); ++i)
            {
                exchange((*this)[i],temp[i]);
            }
            exchange(item,temp[temp.size()-1]);
            temp.swap(*this);
        }
        else
        {
            this->set_size(this->size()+1);
            exchange(item,(*this)[this->size()-1]);
        }
    }